

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalNinjaGenerator::CheckNinjaFeatures(cmGlobalNinjaGenerator *this)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char local_28 [16];
  
  builtin_strncpy(local_28,"1.5",4);
  bVar2 = cmSystemTools::VersionCompare(OP_LESS,(this->NinjaVersion)._M_dataplus._M_p,local_28);
  psVar1 = &this->NinjaVersion;
  this->NinjaSupportsConsolePool = !bVar2;
  builtin_strncpy(local_28,"1.7",4);
  bVar2 = cmSystemTools::VersionCompare(OP_LESS,(psVar1->_M_dataplus)._M_p,local_28);
  this->NinjaSupportsImplicitOuts = !bVar2;
  builtin_strncpy(local_28,"1.8",4);
  bVar2 = cmSystemTools::VersionCompare(OP_LESS,(psVar1->_M_dataplus)._M_p,local_28);
  this->NinjaSupportsManifestRestat = !bVar2;
  builtin_strncpy(local_28,"1.9",4);
  bVar2 = cmSystemTools::VersionCompare(OP_LESS,(psVar1->_M_dataplus)._M_p,local_28);
  this->NinjaSupportsMultilineDepfile = !bVar2;
  if ((CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_), iVar3 != 0)) {
    CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_._M_dataplus._M_p =
         (pointer)&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_,".dyndep-","");
    __cxa_atexit(std::__cxx11::string::~string,&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_);
  }
  lVar4 = std::__cxx11::string::find
                    ((char *)psVar1,
                     (ulong)CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_._M_dataplus._M_p,0);
  if (lVar4 != -1) {
    cmSystemTools::StringToULong
              ((this->NinjaVersion)._M_dataplus._M_p +
               CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_._M_string_length + lVar4,
               &this->NinjaSupportsDyndeps);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::CheckNinjaFeatures()
{
  this->NinjaSupportsConsolePool = !cmSystemTools::VersionCompare(
    cmSystemTools::OP_LESS, this->NinjaVersion.c_str(),
    RequiredNinjaVersionForConsolePool().c_str());
  this->NinjaSupportsImplicitOuts = !cmSystemTools::VersionCompare(
    cmSystemTools::OP_LESS, this->NinjaVersion.c_str(),
    cmGlobalNinjaGenerator::RequiredNinjaVersionForImplicitOuts().c_str());
  this->NinjaSupportsManifestRestat = !cmSystemTools::VersionCompare(
    cmSystemTools::OP_LESS, this->NinjaVersion.c_str(),
    RequiredNinjaVersionForManifestRestat().c_str());
  this->NinjaSupportsMultilineDepfile = !cmSystemTools::VersionCompare(
    cmSystemTools::OP_LESS, this->NinjaVersion.c_str(),
    RequiredNinjaVersionForMultilineDepfile().c_str());
  {
    // Our ninja branch adds ".dyndep-#" to its version number,
    // where '#' is a feature-specific version number.  Extract it.
    static std::string const k_DYNDEP_ = ".dyndep-";
    std::string::size_type pos = this->NinjaVersion.find(k_DYNDEP_);
    if (pos != std::string::npos) {
      const char* fv = this->NinjaVersion.c_str() + pos + k_DYNDEP_.size();
      cmSystemTools::StringToULong(fv, &this->NinjaSupportsDyndeps);
    }
  }
}